

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O1

RpcSystem<capnp::rpc::twoparty::VatId> __thiscall
capnp::
makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
          (capnp *this,
          VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>
          *network)

{
  undefined8 uVar1;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Impl *extraout_RDX_01;
  Impl *pIVar2;
  RpcSystem<capnp::rpc::twoparty::VatId> RVar3;
  Maybe<capnp::Capability::Client> local_40;
  Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
  local_28;
  
  local_40.ptr.isSet = false;
  local_28.ptr.isSet = false;
  RpcSystem<capnp::rpc::twoparty::VatId>::
  RpcSystem<capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)this,network,&local_40,&local_28);
  uVar1 = local_28.ptr.field_1._16_8_;
  pIVar2 = extraout_RDX;
  if ((local_28.ptr.isSet == true) && ((long *)local_28.ptr.field_1._16_8_ != (long *)0x0)) {
    local_28.ptr.field_1._16_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_28.ptr.field_1._8_8_)
              (local_28.ptr.field_1._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    pIVar2 = extraout_RDX_00;
  }
  uVar1 = local_40.ptr.field_1.value.hook.ptr;
  if ((local_40.ptr.isSet == true) && (local_40.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
    local_40.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (**(local_40.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (local_40.ptr.field_1.value.hook.disposer,
               ((ClientHook *)uVar1)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)uVar1)->_vptr_ClientHook);
    pIVar2 = extraout_RDX_01;
  }
  RVar3.super_RpcSystemBase.impl.ptr = pIVar2;
  RVar3.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnp::rpc::twoparty::VatId>)RVar3.super_RpcSystemBase.impl;
}

Assistant:

RpcSystem<VatId> makeRpcClient(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network) {
  return RpcSystem<VatId>(network, nullptr);
}